

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

int ON_EarthAnchorPoint::CompareModelDirection(ON_EarthAnchorPoint *a,ON_EarthAnchorPoint *b)

{
  int local_24;
  int i;
  ON_EarthAnchorPoint *b_local;
  ON_EarthAnchorPoint *a_local;
  
  if (a == (ON_EarthAnchorPoint *)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_EarthAnchorPoint *)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_EarthAnchorPoint *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    local_24 = ON_ComparePoint(3,false,&(a->m_model_point).x,&(b->m_model_point).x);
    if ((local_24 == 0) &&
       (local_24 = ON_ComparePoint(3,false,&(a->m_model_north).x,&(b->m_model_north).x),
       local_24 == 0)) {
      local_24 = ON_ComparePoint(3,false,&(a->m_model_east).x,&(b->m_model_east).x);
    }
    a_local._4_4_ = local_24;
  }
  return a_local._4_4_;
}

Assistant:

int ON_EarthAnchorPoint::CompareModelDirection(const ON_EarthAnchorPoint* a, const ON_EarthAnchorPoint* b)
{
  if ( !a )
  {
    return b ? -1 : 0;
  }
  if (!b)
  {
    return 1;
  }

  int i = ON_ComparePoint(3,false,&a->m_model_point.x,&b->m_model_point.x);
  if ( !i )
  {
    i = ON_ComparePoint(3,false,&a->m_model_north.x,&b->m_model_north.x);
    if ( !i )
    {
      i = ON_ComparePoint(3,false,&a->m_model_east.x,&b->m_model_east.x);
    }
  }
  return i;  
}